

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

Real __thiscall PeleLM::getMFsum(PeleLM *this,MultiFab *a_MF,int comp)

{
  EBCellFlagFab *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int i;
  FabType FVar4;
  EBFArrayBoxFactory *this_01;
  FabArray<amrex::EBCellFlagFab> *pFVar5;
  FabArray<amrex::FArrayBox> *pFVar6;
  int j;
  int iVar7;
  int *piVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  void *__s;
  int j_2;
  long lVar12;
  long lVar13;
  ulong uVar14;
  double *pdVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  double *pdVar23;
  double *pdVar24;
  double dVar25;
  double local_340;
  Box local_32c;
  ulong local_310;
  long local_308;
  long local_300;
  long local_2f8;
  int local_2ec;
  Array4<double> local_2e8;
  Array4<const_double> local_2a8;
  FabArray<amrex::FArrayBox> *local_268;
  PeleLM *local_260;
  long local_258;
  MFIter mfi;
  Array4<const_double> vfrac;
  MultiFab MFTemp;
  
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  mfi.fabArray = (FabArrayBase *)0x0;
  mfi.tile_size.vect[0] = 0;
  mfi.tile_size.vect[1] = 0;
  mfi.tile_size.vect[2] = 0;
  mfi.flags = '\0';
  mfi._29_3_ = 0;
  mfi.currentIndex = 0;
  mfi.beginIndex = 0;
  local_2a8.p = (double *)&PTR__FabFactory_007d2928;
  local_2ec = comp;
  local_260 = this;
  amrex::MultiFab::MultiFab
            (&MFTemp,&(a_MF->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,
             &(a_MF->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,1,0,
             (MFInfo *)&mfi,(FabFactory<amrex::FArrayBox> *)&local_2a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mfi.tile_size);
  amrex::MFIter::MFIter(&mfi,(FabArrayBase *)a_MF,true);
  local_268 = &a_MF->super_FabArray<amrex::FArrayBox>;
  while( true ) {
    pFVar6 = local_268;
    if (mfi.endIndex <= mfi.currentIndex) {
      amrex::MFIter::~MFIter(&mfi);
      vfrac.p = (double *)0x0;
      vfrac.jstride._0_4_ = 0;
      amrex::MFIter::MFIter(&mfi,(FabArrayBase *)&MFTemp,true);
      local_340 = 0.0;
      while (mfi.currentIndex < mfi.endIndex) {
        amrex::MFIter::growntilebox((Box *)&local_2e8,&mfi,(IntVect *)&vfrac);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_2a8,&MFTemp.super_FabArray<amrex::FArrayBox>,&mfi);
        lVar11 = (long)(int)local_2e8.jstride;
        pdVar24 = (double *)
                  ((lVar11 - local_2a8.begin.z) * local_2a8.kstride * 8 +
                   ((long)local_2e8.p._4_4_ - (long)local_2a8.begin.y) * local_2a8.jstride * 8 +
                   (long)(int)local_2e8.p * 8 + (long)local_2a8.begin.x * -8 + (long)local_2a8.p);
        dVar25 = 0.0;
        for (; lVar12 = (long)local_2e8.p._4_4_, pdVar23 = pdVar24,
            lVar11 <= local_2e8.kstride._4_4_; lVar11 = lVar11 + 1) {
          for (; lVar20 = (long)(int)local_2e8.p, pdVar15 = pdVar23,
              lVar12 <= (int)local_2e8.kstride; lVar12 = lVar12 + 1) {
            for (; lVar20 <= local_2e8.jstride._4_4_; lVar20 = lVar20 + 1) {
              dVar25 = dVar25 + *pdVar15;
              pdVar15 = pdVar15 + 1;
            }
            pdVar23 = pdVar23 + local_2a8.jstride;
          }
          pdVar24 = pdVar24 + local_2a8.kstride;
        }
        local_340 = local_340 + dVar25;
        amrex::MFIter::operator++(&mfi);
      }
      amrex::MFIter::~MFIter(&mfi);
      amrex::MultiFab::~MultiFab(&MFTemp);
      return local_340;
    }
    amrex::MFIter::tilebox(&local_32c,&mfi);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_2a8,pFVar6,&mfi,local_2ec);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_2e8,&MFTemp.super_FabArray<amrex::FArrayBox>,&mfi);
    this_01 = (EBFArrayBoxFactory *)
              __dynamic_cast((local_260->super_NavierStokesBase).super_AmrLevel.m_factory._M_t.
                             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                             _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                             &amrex::EBFArrayBoxFactory::typeinfo,0);
    if (this_01 == (EBFArrayBoxFactory *)0x0) break;
    pFVar5 = amrex::EBFArrayBoxFactory::getMultiEBCellFlagFab(this_01);
    piVar8 = &mfi.currentIndex;
    if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
      piVar8 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start + mfi.currentIndex;
    }
    this_00 = (pFVar5->m_fabs_v).
              super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
              _M_impl.super__Vector_impl_data._M_start[*piVar8];
    FVar4 = amrex::EBCellFlagFab::getType(this_00,&local_32c);
    iVar3 = local_32c.bigend.vect[1];
    iVar2 = local_32c.bigend.vect[0];
    iVar1 = local_32c.smallend.vect[0];
    if (FVar4 == covered) {
      local_308 = CONCAT44(local_2e8.kstride._4_4_,(int)local_2e8.kstride);
      lVar12 = (long)local_32c.smallend.vect[0];
      local_310 = (ulong)local_32c.smallend.vect[1];
      local_300 = (long)local_32c.bigend.vect[2];
      uVar10 = local_32c.bigend.vect[0] - local_32c.smallend.vect[0];
      lVar20 = CONCAT44(local_2e8.jstride._4_4_,(int)local_2e8.jstride) * 8;
      local_258 = (local_310 - (long)local_2e8.begin.y) * lVar20 + (long)local_2e8.begin.x * -8 +
                  CONCAT44(local_2e8.p._4_4_,(int)local_2e8.p);
      iVar7 = local_32c.smallend.vect[2] - local_2e8.begin.z;
      for (lVar11 = (long)local_32c.smallend.vect[2]; lVar11 <= local_300; lVar11 = lVar11 + 1) {
        local_2f8 = CONCAT44(local_2f8._4_4_,iVar7);
        __s = (void *)(local_258 + (iVar7 * local_308 + lVar12) * 8);
        for (uVar14 = local_310 & 0xffffffff; (int)uVar14 <= iVar3;
            uVar14 = (ulong)((int)uVar14 + 1)) {
          if (iVar1 <= iVar2) {
            memset(__s,0,(ulong)uVar10 * 8 + 8);
          }
          __s = (void *)((long)__s + lVar20);
        }
        iVar7 = (int)local_2f8 + 1;
      }
    }
    else {
      FVar4 = amrex::EBCellFlagFab::getType(this_00,&local_32c);
      if (FVar4 == regular) {
        lVar20 = (long)local_32c.smallend.vect[1];
        lVar17 = (long)local_32c.smallend.vect[2];
        lVar11 = CONCAT44(local_2e8.kstride._4_4_,(int)local_2e8.kstride) * 8;
        lVar12 = CONCAT44(local_2e8.jstride._4_4_,(int)local_2e8.jstride) * 8;
        lVar18 = (lVar20 - local_2e8.begin.y) * lVar12 + (lVar17 - local_2e8.begin.z) * lVar11 +
                 (long)local_32c.smallend.vect[0] * 8 + (long)local_2e8.begin.x * -8 +
                 CONCAT44(local_2e8.p._4_4_,(int)local_2e8.p);
        lVar21 = (lVar20 - local_2a8.begin.y) * local_2a8.jstride * 8 +
                 (lVar17 - local_2a8.begin.z) * local_2a8.kstride * 8 +
                 (long)local_32c.smallend.vect[0] * 8 + (long)local_2a8.begin.x * -8 +
                 (long)local_2a8.p;
        for (; lVar9 = lVar18, lVar13 = lVar20, lVar22 = lVar21, lVar17 <= local_32c.bigend.vect[2];
            lVar17 = lVar17 + 1) {
          for (; lVar13 <= local_32c.bigend.vect[1]; lVar13 = lVar13 + 1) {
            if (local_32c.smallend.vect[0] <= local_32c.bigend.vect[0]) {
              lVar16 = 0;
              do {
                *(undefined8 *)(lVar9 + lVar16 * 8) = *(undefined8 *)(lVar22 + lVar16 * 8);
                lVar16 = lVar16 + 1;
              } while ((local_32c.bigend.vect[0] - local_32c.smallend.vect[0]) + 1 != (int)lVar16);
            }
            lVar9 = lVar9 + lVar12;
            lVar22 = lVar22 + local_2a8.jstride * 8;
          }
          lVar18 = lVar18 + lVar11;
          lVar21 = lVar21 + local_2a8.kstride * 8;
        }
      }
      else {
        pFVar6 = &amrex::EBFArrayBoxFactory::getVolFrac(this_01)->super_FabArray<amrex::FArrayBox>;
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&vfrac,pFVar6,&mfi);
        local_308 = (long)local_32c.smallend.vect[1];
        lVar12 = (long)local_32c.smallend.vect[2];
        local_300 = CONCAT44(local_2e8.kstride._4_4_,(int)local_2e8.kstride) * 8;
        lVar11 = CONCAT44(local_2e8.jstride._4_4_,(int)local_2e8.jstride) * 8;
        lVar20 = (long)local_32c.smallend.vect[0];
        local_310 = vfrac.kstride * 8;
        lVar17 = CONCAT44(vfrac.jstride._4_4_,(undefined4)vfrac.jstride) * 8;
        local_2f8 = local_2a8.kstride * 8;
        lVar21 = (local_308 - local_2e8.begin.y) * lVar11 + (lVar12 - local_2e8.begin.z) * local_300
                 + lVar20 * 8 + (long)local_2e8.begin.x * -8 +
                 CONCAT44(local_2e8.p._4_4_,(int)local_2e8.p);
        lVar18 = (local_308 - vfrac.begin.y) * lVar17 + (lVar12 - vfrac.begin.z) * local_310 +
                 lVar20 * 8 + (long)vfrac.begin.x * -8 + (long)vfrac.p;
        lVar20 = (local_308 - local_2a8.begin.y) * local_2a8.jstride * 8 +
                 (lVar12 - local_2a8.begin.z) * local_2f8 + lVar20 * 8 +
                 (long)local_2a8.begin.x * -8 + (long)local_2a8.p;
        for (; lVar9 = local_308, lVar13 = lVar18, lVar22 = lVar21, lVar16 = lVar20,
            lVar12 <= local_32c.bigend.vect[2]; lVar12 = lVar12 + 1) {
          for (; lVar9 <= local_32c.bigend.vect[1]; lVar9 = lVar9 + 1) {
            if (local_32c.smallend.vect[0] <= local_32c.bigend.vect[0]) {
              lVar19 = 0;
              do {
                *(double *)(lVar22 + lVar19 * 8) =
                     *(double *)(lVar16 + lVar19 * 8) * *(double *)(lVar13 + lVar19 * 8);
                lVar19 = lVar19 + 1;
              } while ((local_32c.bigend.vect[0] - local_32c.smallend.vect[0]) + 1 != (int)lVar19);
            }
            lVar13 = lVar13 + lVar17;
            lVar22 = lVar22 + lVar11;
            lVar16 = lVar16 + local_2a8.jstride * 8;
          }
          lVar21 = lVar21 + local_300;
          lVar18 = lVar18 + local_310;
          lVar20 = lVar20 + local_2f8;
        }
      }
    }
    amrex::MFIter::operator++(&mfi);
  }
  __cxa_bad_cast();
}

Assistant:

Real
PeleLM::getMFsum(MultiFab& a_MF,
                 int comp)
{
   AMREX_ASSERT(a_MF.nComp() >= comp);

#ifdef AMREX_USE_EB
   //
   // To get vfrac weighted sum, I need to build MF*vfrac and then do the sum
   MultiFab MFTemp(a_MF.boxArray(),a_MF.DistributionMap(),1,0);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(a_MF,TilingIfNotGPU()); mfi.isValid(); ++mfi)
   {
      const Box& bx = mfi.tilebox();
      auto const& dat = a_MF.const_array(mfi,comp);
      auto const& temp = MFTemp.array(mfi);
      auto const& ebfactory = dynamic_cast<EBFArrayBoxFactory const&>(Factory());
      auto const& flagfab = ebfactory.getMultiEBCellFlagFab()[mfi];
      auto const& flag    = flagfab.const_array();

      if (flagfab.getType(bx) == FabType::covered) {              // Covered boxes
         amrex::ParallelFor(bx, [temp]
         AMREX_GPU_DEVICE( int i, int j, int k) noexcept
         {
            temp(i,j,k) = 0.0;
         });
      } else if (flagfab.getType(bx) == FabType::regular ) {     // Regular boxes
         amrex::ParallelFor(bx, [dat,temp]
         AMREX_GPU_DEVICE( int i, int j, int k) noexcept
         {
            temp(i,j,k) = dat(i,j,k);
         });
      } else {                                                   // EB containing boxes
         auto vfrac = ebfactory.getVolFrac().const_array(mfi);
         amrex::ParallelFor(bx, [dat,temp,vfrac]
         AMREX_GPU_DEVICE( int i, int j, int k) noexcept
         {
            temp(i,j,k) = dat(i,j,k) * vfrac(i,j,k);
         });
      }
   }

   Real weighted_sum = amrex::ReduceSum(MFTemp, 0, []
   AMREX_GPU_HOST_DEVICE (Box const& bx, Array4<Real const> const& dat ) noexcept -> Real
   {
      Real r = 0.0;
      AMREX_LOOP_3D(bx,i,j,k,
      {
         r += dat(i,j,k);
      });
      return r;
   });
   ParallelDescriptor::ReduceRealSum(weighted_sum);

   return weighted_sum;
#else
   Real sum = a_MF.sum(comp,false);
   return sum;
#endif
}